

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int key_schedule_extract(ptls_key_schedule_t *sched,ptls_iovec_t ikm)

{
  ptls_hash_algorithm_t *ppVar1;
  size_t outlen;
  int iVar2;
  ptls_iovec_t pVar3;
  ptls_iovec_t pVar4;
  ptls_key_schedule_t *local_40;
  uint8_t *local_38;
  int ret;
  ptls_key_schedule_t *sched_local;
  ptls_iovec_t ikm_local;
  
  ikm_local.base = (uint8_t *)ikm.len;
  sched_local = (ptls_key_schedule_t *)ikm.base;
  if (sched_local == (ptls_key_schedule_t *)0x0) {
    pVar3 = ptls_iovec_init("",(sched->hashes[0].algo)->digest_size);
    local_40 = (ptls_key_schedule_t *)pVar3.base;
    sched_local = local_40;
    local_38 = (uint8_t *)pVar3.len;
    ikm_local.base = local_38;
  }
  if (sched->generation != 0) {
    ppVar1 = sched->hashes[0].algo;
    outlen = (sched->hashes[0].algo)->digest_size;
    pVar3 = ptls_iovec_init(sched->secret,(sched->hashes[0].algo)->digest_size);
    pVar4 = ptls_iovec_init((sched->hashes[0].algo)->empty_digest,
                            (sched->hashes[0].algo)->digest_size);
    iVar2 = ptls_hkdf_expand_label(ppVar1,sched->secret,outlen,pVar3,"derived",pVar4,(char *)0x0);
    if (iVar2 != 0) {
      return iVar2;
    }
  }
  sched->generation = sched->generation + 1;
  ppVar1 = sched->hashes[0].algo;
  pVar4 = ptls_iovec_init(sched->secret,(sched->hashes[0].algo)->digest_size);
  pVar3.len = (size_t)ikm_local.base;
  pVar3.base = (uint8_t *)sched_local;
  iVar2 = ptls_hkdf_extract(ppVar1,sched->secret,pVar4,pVar3);
  return iVar2;
}

Assistant:

static int key_schedule_extract(ptls_key_schedule_t *sched, ptls_iovec_t ikm)
{
    int ret;

    if (ikm.base == NULL)
        ikm = ptls_iovec_init(zeroes_of_max_digest_size, sched->hashes[0].algo->digest_size);

    if (sched->generation != 0 &&
        (ret = ptls_hkdf_expand_label(sched->hashes[0].algo, sched->secret, sched->hashes[0].algo->digest_size,
                                      ptls_iovec_init(sched->secret, sched->hashes[0].algo->digest_size), "derived",
                                      ptls_iovec_init(sched->hashes[0].algo->empty_digest, sched->hashes[0].algo->digest_size),
                                      NULL)) != 0)
        return ret;

    ++sched->generation;
    ret = ptls_hkdf_extract(sched->hashes[0].algo, sched->secret,
                            ptls_iovec_init(sched->secret, sched->hashes[0].algo->digest_size), ikm);
    PTLS_DEBUGF("%s: %u, %02x%02x\n", __FUNCTION__, sched->generation, (int)sched->secret[0], (int)sched->secret[1]);
    return ret;
}